

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiTableColumn::ImGuiTableColumn(ImGuiTableColumn *this)

{
  ImRect *in_RDI;
  
  ImRect::ImRect(in_RDI);
  memset(in_RDI,0,0x68);
  in_RDI[1].Min.x = -1.0;
  in_RDI[1].Max.x = -1.0;
  *(undefined2 *)&in_RDI[5].Min.x = 0xffff;
  *(undefined1 *)((long)&in_RDI[5].Min.x + 3) = 0xff;
  *(undefined1 *)((long)&in_RDI[5].Min.x + 2) = 0xff;
  *(undefined1 *)((long)&in_RDI[5].Min.y + 1) = 0xff;
  *(undefined1 *)&in_RDI[5].Min.y = 0xff;
  *(undefined1 *)((long)&in_RDI[5].Min.y + 2) = 0xff;
  *(byte *)((long)&in_RDI[6].Min.y + 1) = *(byte *)((long)&in_RDI[6].Min.y + 1) & 0xfc;
  *(undefined1 *)((long)&in_RDI[5].Max.x + 1) = 0xff;
  *(undefined1 *)&in_RDI[5].Max.x = 0xff;
  *(undefined1 *)((long)&in_RDI[5].Min.y + 3) = 0xff;
  return;
}

Assistant:

ImGuiTableColumn()
    {
        memset(this, 0, sizeof(*this));
        StretchWeight = WidthRequest = -1.0f;
        NameOffset = -1;
        DisplayOrder = IndexWithinEnabledSet = -1;
        PrevEnabledColumn = NextEnabledColumn = -1;
        SortOrder = -1;
        SortDirection = ImGuiSortDirection_None;
        DrawChannelCurrent = DrawChannelFrozen = DrawChannelUnfrozen = (ImU8)-1;
    }